

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  bool bVar1;
  pointer ppVar2;
  TestError *pTVar3;
  string *local_6b0;
  string *local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  string local_3f8 [8];
  string shader_source_1;
  size_t invalid_size_declarations_index_1;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_3c8;
  iterator local_3c0;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_3b8;
  _supported_variable_types_map_const_iterator var_iterator_1;
  size_t var_type_index_1;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  undefined1 local_318 [8];
  string shader_source;
  size_t invalid_size_declarations_index;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_2e8;
  iterator local_2e0;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_2d8;
  _supported_variable_types_map_const_iterator var_iterator;
  size_t var_type_index;
  size_t num_var_types;
  test_var_type *var_types_set;
  string *local_2b0;
  string local_2a8 [8];
  string array_initializers [4];
  allocator<char> local_220;
  allocator<char> local_21f;
  allocator<char> local_21e;
  allocator<char> local_21d;
  allocator<char> local_21c;
  allocator<char> local_21b;
  allocator<char> local_21a;
  allocator<char> local_219;
  allocator<char> local_218;
  allocator<char> local_217;
  allocator<char> local_216;
  allocator<char> local_215 [20];
  allocator<char> local_201;
  string *local_200;
  string local_1f8 [8];
  string invalid_size_declarations [15];
  TestShaderType tested_shader_type_local;
  InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  array_initializers[3].field_2._M_local_buf[0xd] = '\x01';
  local_200 = local_1f8;
  invalid_size_declarations[0xe].field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f8,"[2][2][2][]",&local_201);
  local_200 = (string *)(invalid_size_declarations[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[0].field_2._M_local_buf + 8),"[2][2][][2]",
             local_215);
  local_200 = (string *)(invalid_size_declarations[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[1].field_2._M_local_buf + 8),"[2][][2][2]",
             &local_216);
  local_200 = (string *)(invalid_size_declarations[2].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[2].field_2._M_local_buf + 8),"[][2][2][2]",
             &local_217);
  local_200 = (string *)(invalid_size_declarations[3].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[3].field_2._M_local_buf + 8),"[2][2][][]",
             &local_218);
  local_200 = (string *)(invalid_size_declarations[4].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[4].field_2._M_local_buf + 8),"[2][][2][]",
             &local_219);
  local_200 = (string *)(invalid_size_declarations[5].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[5].field_2._M_local_buf + 8),"[][2][2][]",
             &local_21a);
  local_200 = (string *)(invalid_size_declarations[6].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[6].field_2._M_local_buf + 8),"[2][][][2]",
             &local_21b);
  local_200 = (string *)(invalid_size_declarations[7].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[7].field_2._M_local_buf + 8),"[][2][][2]",
             &local_21c);
  local_200 = (string *)(invalid_size_declarations[8].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[8].field_2._M_local_buf + 8),"[][][2][2]",
             &local_21d);
  local_200 = (string *)(invalid_size_declarations[9].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[9].field_2._M_local_buf + 8),"[2][][][]",
             &local_21e);
  local_200 = (string *)(invalid_size_declarations[10].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[10].field_2._M_local_buf + 8),"[][2][][]",
             &local_21f);
  local_200 = (string *)(invalid_size_declarations[0xb].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[0xb].field_2._M_local_buf + 8),"[][][2][]",
             &local_220);
  local_200 = (string *)(invalid_size_declarations[0xc].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[0xc].field_2._M_local_buf + 8),"[][][][2]",
             (allocator<char> *)(array_initializers[3].field_2._M_local_buf + 0xf));
  local_200 = (string *)(invalid_size_declarations[0xd].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[0xd].field_2._M_local_buf + 8),"[][][][]",
             (allocator<char> *)(array_initializers[3].field_2._M_local_buf + 0xe));
  array_initializers[3].field_2._M_local_buf[0xd] = '\0';
  std::allocator<char>::~allocator
            ((allocator<char> *)(array_initializers[3].field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator
            ((allocator<char> *)(array_initializers[3].field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator(&local_220);
  std::allocator<char>::~allocator(&local_21f);
  std::allocator<char>::~allocator(&local_21e);
  std::allocator<char>::~allocator(&local_21d);
  std::allocator<char>::~allocator(&local_21c);
  std::allocator<char>::~allocator(&local_21b);
  std::allocator<char>::~allocator(&local_21a);
  std::allocator<char>::~allocator(&local_219);
  std::allocator<char>::~allocator(&local_218);
  std::allocator<char>::~allocator(&local_217);
  std::allocator<char>::~allocator(&local_216);
  std::allocator<char>::~allocator(local_215);
  std::allocator<char>::~allocator(&local_201);
  var_types_set._3_1_ = 1;
  local_2b0 = local_2a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a8,
             "float[2][2][2][2](float[2][2][2](float[2][2](float[2](1.0, 2.0),float[2](3.0, 4.0)),float[2][2](float[2](5.0, 6.0),float[2](7.0, 8.0))),float[2][2][2](float[2][2](float[2](1.1, 2.1),float[2](3.1, 4.1)),float[2][2](float[2](5.1, 6.1),float[2](7.1, 8.1))));\n"
             ,(allocator<char> *)((long)&var_types_set + 7));
  local_2b0 = (string *)(array_initializers[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(array_initializers[0].field_2._M_local_buf + 8),
             "int[2][2][2][2](int[2][2][2](int[2][2](int[2]( 1,  2),int[2]( 3,  4)),int[2][2](int[2]( 5,  6),int[2]( 7,  8))),int[2][2][2](int[2][2](int[2](11, 12),int[2](13, 14)),int[2][2](int[2](15, 16),int[2](17, 18))));\n"
             ,(allocator<char> *)((long)&var_types_set + 6));
  local_2b0 = (string *)(array_initializers[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(array_initializers[1].field_2._M_local_buf + 8),
             "uint[2][2][2][2](uint[2][2][2](uint[2][2](uint[2]( 1u,  2u),uint[2]( 3u,  4u)),uint[2][2](uint[2]( 5u,  6u),uint[2]( 7u,  8u))),uint[2][2][2](uint[2][2](uint[2](11u, 12u),uint[2](13u, 14u)),uint[2][2](uint[2](15u, 16u),uint[2](17u, 18u))));\n"
             ,(allocator<char> *)((long)&var_types_set + 5));
  local_2b0 = (string *)(array_initializers[2].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(array_initializers[2].field_2._M_local_buf + 8),
             "double[2][2][2][2](double[2][2][2](double[2][2](double[2](1.0, 2.0),double[2](3.0, 4.0)),double[2][2](double[2](5.0, 6.0),double[2](7.0, 8.0))),double[2][2][2](double[2][2](double[2](1.1, 2.1),double[2](3.1, 4.1)),double[2][2](double[2](5.1, 6.1),double[2](7.1, 8.1))));\n"
             ,(allocator<char> *)((long)&var_types_set + 4));
  var_types_set._3_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&var_types_set + 4));
  std::allocator<char>::~allocator((allocator<char> *)((long)&var_types_set + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&var_types_set + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&var_types_set + 7));
  var_iterator._M_node = (_Base_ptr)0x0;
  while( true ) {
    if ((_Base_ptr)0x3 < var_iterator._M_node) {
      var_iterator_1._M_node = (_Base_ptr)0x0;
      while( true ) {
        if ((_Base_ptr)0x3 < var_iterator_1._M_node) {
          local_698 = (string *)(array_initializers[3].field_2._M_local_buf + 8);
          do {
            local_698 = local_698 + -0x20;
            std::__cxx11::string::~string(local_698);
          } while (local_698 != local_2a8);
          local_6b0 = (string *)(invalid_size_declarations[0xe].field_2._M_local_buf + 8);
          do {
            local_6b0 = local_6b0 + -0x20;
            std::__cxx11::string::~string(local_6b0);
          } while (local_6b0 != local_1f8);
          return;
        }
        local_3c0._M_node =
             (_Base_ptr)
             std::
             map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
             ::find((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                     *)supported_variable_types_map,
                    test_shader_compilation::var_types_set_gl + (long)var_iterator_1._M_node);
        std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
        ::_Rb_tree_const_iterator(&local_3b8,&local_3c0);
        invalid_size_declarations_index_1 =
             (size_t)std::
                     map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                     ::end((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                            *)supported_variable_types_map);
        std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
        ::_Rb_tree_const_iterator(&local_3c8,(iterator *)&invalid_size_declarations_index_1);
        bVar1 = std::operator!=(&local_3b8,&local_3c8);
        if (!bVar1) break;
        for (shader_source_1.field_2._8_8_ = 0; (ulong)shader_source_1.field_2._8_8_ < 0xf;
            shader_source_1.field_2._8_8_ = shader_source_1.field_2._8_8_ + 1) {
          std::__cxx11::string::string(local_3f8);
          std::__cxx11::string::operator=(local_3f8,"layout (std140) uniform MyUniform {\n");
          ppVar2 = std::
                   _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
                   ::operator->(&local_3b8);
          std::operator+(&local_478,"    ",&(ppVar2->second).type);
          std::operator+(&local_458,&local_478,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&invalid_size_declarations[shader_source_1.field_2._8_8_ + -1].
                                 field_2 + 8));
          std::operator+(&local_438,&local_458," my_variable = ");
          std::operator+(&local_418,&local_438,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&array_initializers
                                 [(long)((long)&var_iterator_1._M_node[-1]._M_right + 7)].field_2 +
                         8));
          std::__cxx11::string::operator+=(local_3f8,(string *)&local_418);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&local_438);
          std::__cxx11::string::~string((string *)&local_458);
          std::__cxx11::string::~string((string *)&local_478);
          ppVar2 = std::
                   _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
                   ::operator->(&local_3b8);
          std::operator+(&local_4d8,&(ppVar2->second).type,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&invalid_size_declarations[shader_source_1.field_2._8_8_ + -1].
                                 field_2 + 8));
          std::operator+(&local_4b8,&local_4d8," my_variable = ");
          std::operator+(&local_498,&local_4b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&array_initializers
                                 [(long)((long)&var_iterator_1._M_node[-1]._M_right + 7)].field_2 +
                         8));
          std::__cxx11::string::~string((string *)&local_498);
          std::__cxx11::string::~string((string *)&local_4b8);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::operator+=(local_3f8,"};\n\n");
          std::__cxx11::string::operator+=(local_3f8,(string *)shader_start_abi_cxx11_);
          switch(invalid_size_declarations[0xe].field_2._12_4_) {
          case 0:
            break;
          case 1:
            std::__cxx11::string::operator+=(local_3f8,"\n\tgl_Position = vec4(0.0);\n");
            break;
          case 2:
            break;
          case 3:
            std::__cxx11::string::operator+=(local_3f8,(string *)emit_quad_abi_cxx11_);
            break;
          case 4:
            std::__cxx11::string::operator+=(local_3f8,(string *)set_tesseation_abi_cxx11_);
            break;
          case 5:
            break;
          default:
            pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar3,"Unrecognized shader type.",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                       ,0x1c72);
            __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          std::__cxx11::string::operator+=(local_3f8,(string *)shader_end_abi_cxx11_);
          (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
            super_TestNode._vptr_TestNode[8])
                    (this,(ulong)(uint)invalid_size_declarations[0xe].field_2._12_4_,local_3f8);
          std::__cxx11::string::~string(local_3f8);
        }
        var_iterator_1._M_node = (_Base_ptr)((long)&(var_iterator_1._M_node)->_M_color + 1);
      }
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1c7a);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_2e0._M_node =
         (_Base_ptr)
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::find((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                 *)supported_variable_types_map,
                test_shader_compilation::var_types_set_gl + (long)var_iterator._M_node);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_2d8,&local_2e0);
    invalid_size_declarations_index =
         (size_t)std::
                 map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                 ::end((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                        *)supported_variable_types_map);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_2e8,(iterator *)&invalid_size_declarations_index);
    bVar1 = std::operator!=(&local_2d8,&local_2e8);
    if (!bVar1) break;
    for (shader_source.field_2._8_8_ = 0; (ulong)shader_source.field_2._8_8_ < 0xf;
        shader_source.field_2._8_8_ = shader_source.field_2._8_8_ + 1) {
      std::__cxx11::string::string((string *)local_318);
      std::__cxx11::string::operator=((string *)local_318,"layout (std140) uniform MyUniform {\n");
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
               ::operator->(&local_2d8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs,"    "
                     ,&(ppVar2->second).type);
      std::operator+(&local_358,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&invalid_size_declarations[shader_source.field_2._8_8_ + -1].field_2 + 8
                     ));
      std::operator+(&local_338,&local_358," my_variable;\n");
      std::__cxx11::string::operator+=((string *)local_318,(string *)&local_338);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&cs);
      std::__cxx11::string::operator+=((string *)local_318,"};\n\n");
      std::__cxx11::string::operator+=((string *)local_318,(string *)shader_start_abi_cxx11_);
      switch(invalid_size_declarations[0xe].field_2._12_4_) {
      case 0:
        break;
      case 1:
        std::__cxx11::string::operator+=((string *)local_318,"\n\tgl_Position = vec4(0.0);\n");
        break;
      case 2:
        break;
      case 3:
        std::__cxx11::string::operator+=((string *)local_318,(string *)emit_quad_abi_cxx11_);
        break;
      case 4:
        std::__cxx11::string::operator+=((string *)local_318,(string *)set_tesseation_abi_cxx11_);
        break;
      case 5:
        break;
      default:
        pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar3,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0x1c49);
        __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      std::__cxx11::string::operator+=((string *)local_318,(string *)shader_end_abi_cxx11_);
      if (shader_source.field_2._8_8_ == 3) {
        vs = (string *)empty_string_abi_cxx11_;
        tcs = (string *)default_vertex_shader_source_abi_cxx11_;
        tes = (string *)default_tc_shader_source_abi_cxx11_;
        gs = (string *)default_te_shader_source_abi_cxx11_;
        fs = (string *)default_geometry_shader_source_abi_cxx11_;
        var_type_index_1 = (size_t)default_fragment_shader_source_abi_cxx11_;
        switch(invalid_size_declarations[0xe].field_2._12_4_) {
        case 0:
          var_type_index_1 = (size_t)local_318;
          break;
        case 1:
          tcs = (string *)local_318;
          break;
        case 2:
          vs = (string *)local_318;
          tcs = (string *)empty_string_abi_cxx11_;
          tes = (string *)empty_string_abi_cxx11_;
          gs = (string *)empty_string_abi_cxx11_;
          fs = (string *)empty_string_abi_cxx11_;
          var_type_index_1 = (size_t)empty_string_abi_cxx11_;
          break;
        case 3:
          fs = (string *)local_318;
          break;
        case 4:
          tes = (string *)local_318;
          break;
        case 5:
          gs = (string *)local_318;
          break;
        default:
          pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar3,"Invalid enum",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                     ,0x1c4d);
          __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
          super_TestNode._vptr_TestNode[10])(this,tcs,tes,gs,fs,var_type_index_1,vs,1,0);
      }
      else {
        (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
          super_TestNode._vptr_TestNode[8])
                  (this,(ulong)(uint)invalid_size_declarations[0xe].field_2._12_4_,local_318);
      }
      std::__cxx11::string::~string((string *)local_318);
    }
    var_iterator._M_node = (_Base_ptr)((long)&(var_iterator._M_node)->_M_color + 1);
  }
  pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar3,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x1c52);
  __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void InteractionUniformBuffers3<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT,
															 VAR_TYPE_DOUBLE };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const std::string invalid_size_declarations[] = { "[2][2][2][]", "[2][2][][2]", "[2][][2][2]", "[][2][2][2]",
													  "[2][2][][]",  "[2][][2][]",  "[][2][2][]",  "[2][][][2]",
													  "[][2][][2]",  "[][][2][2]",  "[2][][][]",   "[][2][][]",
													  "[][][2][]",   "[][][][2]",   "[][][][]" };

	const std::string array_initializers[] = { "float[2][2][2][2](float[2][2][2](float[2][2](float[2](1.0, 2.0),"
											   "float[2](3.0, 4.0)),"
											   "float[2][2](float[2](5.0, 6.0),"
											   "float[2](7.0, 8.0))),"
											   "float[2][2][2](float[2][2](float[2](1.1, 2.1),"
											   "float[2](3.1, 4.1)),"
											   "float[2][2](float[2](5.1, 6.1),"
											   "float[2](7.1, 8.1))));\n",

											   "int[2][2][2][2](int[2][2][2](int[2][2](int[2]( 1,  2),"
											   "int[2]( 3,  4)),"
											   "int[2][2](int[2]( 5,  6),"
											   "int[2]( 7,  8))),"
											   "int[2][2][2](int[2][2](int[2](11, 12),"
											   "int[2](13, 14)),"
											   "int[2][2](int[2](15, 16),"
											   "int[2](17, 18))));\n",

											   "uint[2][2][2][2](uint[2][2][2](uint[2][2](uint[2]( 1u,  2u),"
											   "uint[2]( 3u,  4u)),"
											   "uint[2][2](uint[2]( 5u,  6u),"
											   "uint[2]( 7u,  8u))),"
											   "uint[2][2][2](uint[2][2](uint[2](11u, 12u),"
											   "uint[2](13u, 14u)),"
											   "uint[2][2](uint[2](15u, 16u),"
											   "uint[2](17u, 18u))));\n",

											   "double[2][2][2][2](double[2][2][2](double[2][2](double[2](1.0, 2.0),"
											   "double[2](3.0, 4.0)),"
											   "double[2][2](double[2](5.0, 6.0),"
											   "double[2](7.0, 8.0))),"
											   "double[2][2][2](double[2][2](double[2](1.1, 2.1),"
											   "double[2](3.1, 4.1)),"
											   "double[2][2](double[2](5.1, 6.1),"
											   "double[2](7.1, 8.1))));\n" };
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	/* Iterate through float/ int/ uint types.
	 * Case: without initializer.
	 */
	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			for (size_t invalid_size_declarations_index = 0;
				 invalid_size_declarations_index <
				 sizeof(invalid_size_declarations) / sizeof(invalid_size_declarations[0]);
				 invalid_size_declarations_index++)
			{
				std::string shader_source;

				shader_source = "layout (std140) uniform MyUniform {\n";
				shader_source += "    " + var_iterator->second.type +
								 invalid_size_declarations[invalid_size_declarations_index] + " my_variable;\n";
				shader_source += "};\n\n";
				shader_source += shader_start;

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				EXECUTE_SHADER_TEST(API::ALLOW_UNSIZED_DECLARATION && invalid_size_declarations_index == 3,
									tested_shader_type, shader_source);
			} /* for (int invalid_size_declarations_index = 0; ...) */
		}
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */

	/* Iterate through float/ int/ uint types.
	 * Case: with initializer.
	 */
	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			for (size_t invalid_size_declarations_index = 0;
				 invalid_size_declarations_index <
				 sizeof(invalid_size_declarations) / sizeof(invalid_size_declarations[0]);
				 invalid_size_declarations_index++)
			{
				std::string shader_source;

				shader_source = "layout (std140) uniform MyUniform {\n";
				shader_source += "    " + var_iterator->second.type +
								 invalid_size_declarations[invalid_size_declarations_index] +
								 " my_variable = " + array_initializers[var_type_index];

				var_iterator->second.type + invalid_size_declarations[invalid_size_declarations_index] +
					" my_variable = " + array_initializers[var_type_index];
				shader_source += "};\n\n";
				shader_source += shader_start;

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				this->execute_negative_test(tested_shader_type, shader_source);
			} /* for (int invalid_size_declarations_index = 0; ...) */
		}	 /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}